

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.cpp
# Opt level: O0

void TestEventComparisonNode(void)

{
  bool bVar1;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  Comparison local_2fc;
  undefined1 local_2f8 [8];
  EventComparisonNode greater;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  Comparison local_1ac;
  undefined1 local_1a8 [8];
  EventComparisonNode equal;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  Comparison local_4c;
  undefined1 local_48 [8];
  EventComparisonNode less_eq;
  Date january_1;
  
  less_eq.event.field_2._8_8_ = 0x1000007b2;
  local_4c = LessOrEqual;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"b",&local_71);
  EventComparisonNode::EventComparisonNode((EventComparisonNode *)local_48,&local_4c,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"a",&local_a9);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_48,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"EventComparisonNode: less_eq 1",&local_d1);
  Assert(bVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"c",&local_f9);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_48,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"EventComparisonNode: less_eq 2",&local_121);
  Assert(!bVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"b",&local_149);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_48,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"EventComparisonNode: less_eq 3",
             (allocator<char> *)(equal.event.field_2._M_local_buf + 0xf));
  Assert(bVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)(equal.event.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  local_1ac = Equal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"b",&local_1d1);
  EventComparisonNode::EventComparisonNode((EventComparisonNode *)local_1a8,&local_1ac,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"b",&local_1f9);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_1a8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"EventComparisonNode: equal 1",&local_221);
  Assert(bVar1,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"a",&local_249);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_1a8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"EventComparisonNode: equal 2",&local_271);
  Assert(!bVar1,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"c",&local_299);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_1a8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"EventComparisonNode: equal 3",
             (allocator<char> *)(greater.event.field_2._M_local_buf + 0xf));
  Assert(!bVar1,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)(greater.event.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  local_2fc = Greater;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"b",&local_321);
  EventComparisonNode::EventComparisonNode((EventComparisonNode *)local_2f8,&local_2fc,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"c",&local_349);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_2f8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"EventComparisonNode: greater 1",&local_371);
  Assert(bVar1,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"b",&local_399);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_2f8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"EventComparisonNode: greater 2",&local_3c1);
  Assert(!bVar1,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"a",&local_3e9);
  bVar1 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_2f8,(Date *)((long)&less_eq.event.field_2 + 8),
                     &local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"EventComparisonNode: greater 3",&local_411);
  Assert(!bVar1,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  EventComparisonNode::~EventComparisonNode((EventComparisonNode *)local_2f8);
  EventComparisonNode::~EventComparisonNode((EventComparisonNode *)local_1a8);
  EventComparisonNode::~EventComparisonNode((EventComparisonNode *)local_48);
  return;
}

Assistant:

void TestEventComparisonNode() {
    const Date january_1{1970, 1, 1};

    EventComparisonNode less_eq(Comparison::LessOrEqual, "b");
    Assert(less_eq.Evaluate(january_1, "a"), "EventComparisonNode: less_eq 1");
    Assert(!less_eq.Evaluate(january_1, "c"), "EventComparisonNode: less_eq 2");
    Assert(less_eq.Evaluate(january_1, "b"), "EventComparisonNode: less_eq 3");

    EventComparisonNode equal(Comparison::Equal, "b");
    Assert(equal.Evaluate(january_1, "b"), "EventComparisonNode: equal 1");
    Assert(!equal.Evaluate(january_1, "a"), "EventComparisonNode: equal 2");
    Assert(!equal.Evaluate(january_1, "c"), "EventComparisonNode: equal 3");

    EventComparisonNode greater(Comparison::Greater, "b");
    Assert(greater.Evaluate(january_1, "c"), "EventComparisonNode: greater 1");
    Assert(!greater.Evaluate(january_1, "b"), "EventComparisonNode: greater 2");
    Assert(!greater.Evaluate(january_1, "a"), "EventComparisonNode: greater 3");
}